

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IFCReaderGen_2x3.h
# Opt level: O3

void __thiscall
Assimp::IFC::Schema_2x3::IfcPropertyListValue::~IfcPropertyListValue(IfcPropertyListValue *this)

{
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *this_00;
  
  *(undefined ***)this = &PTR__IfcPropertyListValue_0091d860;
  *(undefined ***)&this->field_0xa8 = &PTR__IfcPropertyListValue_0091d8d8;
  *(undefined ***)&this->field_0x58 = &PTR__IfcPropertyListValue_0091d888;
  (this->super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcPropertyListValue,_2UL>)._vptr_ObjectHelper
       = (_func_int **)&PTR__IfcPropertyListValue_0091d8b0;
  this_00 = (this->Unit).ptr.
            super___shared_ptr<const_Assimp::STEP::EXPRESS::DataType,_(__gnu_cxx::_Lock_policy)2>.
            _M_refcount._M_pi;
  if (this_00 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(this_00);
  }
  std::
  vector<std::shared_ptr<const_Assimp::STEP::EXPRESS::DataType>,_std::allocator<std::shared_ptr<const_Assimp::STEP::EXPRESS::DataType>_>_>
  ::~vector((vector<std::shared_ptr<const_Assimp::STEP::EXPRESS::DataType>,_std::allocator<std::shared_ptr<const_Assimp::STEP::EXPRESS::DataType>_>_>
             *)&(this->super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcPropertyListValue,_2UL>).
                field_0x10);
  *(undefined8 *)this = 0x91d9f0;
  *(undefined8 *)&this->field_0xa8 = 0x91da18;
  if (*(undefined1 **)&this->field_0x30 != &this->field_0x40) {
    operator_delete(*(undefined1 **)&this->field_0x30,*(long *)&this->field_0x40 + 1);
  }
  if (*(undefined1 **)&this->field_0x10 != &this->field_0x20) {
    operator_delete(*(undefined1 **)&this->field_0x10,*(long *)&this->field_0x20 + 1);
  }
  operator_delete(this,0xc0);
  return;
}

Assistant:

IfcPropertyListValue() : Object("IfcPropertyListValue") {}